

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

_Bool sx_coro_replace_callback(sx_coro_context *ctx,sx_fiber_cb *callback,sx_fiber_cb *new_callback)

{
  int iVar1;
  sx__coro_state *psVar2;
  sx__coro_state *psVar3;
  sx__coro_state *psVar4;
  sx_pool *psVar5;
  code *pcVar6;
  sx__coro_state *psVar7;
  undefined1 uVar8;
  _Bool _Var9;
  sx_fiber_t pvVar10;
  uintptr_t uptr;
  sx__pool_page *psVar11;
  
  if (callback == (sx_fiber_cb *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x119,"callback");
    pcVar6 = (code *)swi(3);
    uVar8 = (*pcVar6)();
    return (_Bool)uVar8;
  }
  _Var9 = false;
  psVar2 = ctx->run_list;
  while( true ) {
    while( true ) {
      do {
        psVar7 = psVar2;
        if (psVar7 == (sx__coro_state *)0x0) {
          return _Var9;
        }
        psVar2 = psVar7->next;
      } while (psVar7->callback != callback);
      if (new_callback == (sx_fiber_cb *)0x0) break;
      psVar7->callback = new_callback;
      pvVar10 = (sx_fiber_t)
                make_fcontext((psVar7->stack_mem).sptr,(psVar7->stack_mem).ssize,new_callback);
      psVar7->fiber = pvVar10;
      _Var9 = true;
    }
    psVar3 = psVar7->prev;
    if (psVar3 != (sx__coro_state *)0x0) {
      psVar3->next = psVar2;
    }
    psVar4 = psVar7->next;
    if (psVar4 != (sx__coro_state *)0x0) {
      psVar4->prev = psVar3;
    }
    if (ctx->run_list == psVar7) {
      ctx->run_list = psVar4;
    }
    if (ctx->run_list_last == psVar7) {
      ctx->run_list_last = psVar7->prev;
    }
    psVar7->next = (sx__coro_state *)0x0;
    psVar7->prev = (sx__coro_state *)0x0;
    psVar5 = ctx->coro_pool;
    psVar11 = psVar5->pages;
    if (psVar11 == (sx__pool_page *)0x0) break;
    while ((psVar3 = (sx__coro_state *)psVar11->buff, psVar7 < psVar3 ||
           ((sx__coro_state *)
            ((long)&psVar3->fiber + (long)psVar5->item_sz * (long)psVar5->capacity) <= psVar7))) {
      psVar11 = psVar11->next;
      if (psVar11 == (sx__pool_page *)0x0) goto LAB_0010a55e;
    }
    if ((ulong)((long)psVar7 - (long)psVar3) % (ulong)(long)psVar5->item_sz != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0xd6,"ptr is not aligned to items, probably invalid");
      pcVar6 = (code *)swi(3);
      uVar8 = (*pcVar6)();
      return (_Bool)uVar8;
    }
    if (psVar11->iter == psVar5->capacity) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0xd8,"cannot delete more objects, possible double delete");
      pcVar6 = (code *)swi(3);
      uVar8 = (*pcVar6)();
      return (_Bool)uVar8;
    }
    iVar1 = psVar11->iter;
    psVar11->iter = iVar1 + 1;
    psVar11->ptrs[iVar1] = psVar7;
  }
LAB_0010a55e:
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                    ,0xe0,"pointer does not blong to the pool");
  pcVar6 = (code *)swi(3);
  uVar8 = (*pcVar6)();
  return (_Bool)uVar8;
}

Assistant:

bool sx_coro_replace_callback(sx_coro_context* ctx, sx_fiber_cb* callback,
                              sx_fiber_cb* new_callback)
{
    sx_assert(callback);
    bool r = false;

    sx__coro_state* fs = ctx->run_list;
    while (fs) {
        sx__coro_state* next = fs->next;

        // just remove the fiber if the new callback is NULL
        if (fs->callback == callback) {
            if (new_callback) {
                fs->callback = new_callback;
                fs->fiber = sx_fiber_create(fs->stack_mem, new_callback);
                r = true;
            } else {
                sx__coro_remove_list(&ctx->run_list, &ctx->run_list_last, fs);
                sx_pool_del(ctx->coro_pool, fs);
            }
        }
        fs = next;
    }

    return r;
}